

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O2

void Llb_CoreStop(Llb_Img_t *p)

{
  DdManager *table;
  DdNode *pDVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  
  pVVar3 = p->vDdMans;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    for (iVar2 = 0; iVar2 < pVVar3->nSize; iVar2 = iVar2 + 1) {
      table = (DdManager *)Vec_PtrEntry(pVVar3,iVar2);
      if (table->bFunc != (DdNode *)0x0) {
        Cudd_RecursiveDeref(table,table->bFunc);
      }
      if (table->bFunc2 != (DdNode *)0x0) {
        Cudd_RecursiveDeref(table,table->bFunc2);
      }
      Extra_StopManager(table);
      pVVar3 = p->vDdMans;
    }
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      p->vDdMans->pArray = (void **)0x0;
      pVVar3 = p->vDdMans;
      if (pVVar3 == (Vec_Ptr_t *)0x0) goto LAB_00695b50;
    }
    free(pVVar3);
    p->vDdMans = (Vec_Ptr_t *)0x0;
  }
LAB_00695b50:
  pDVar1 = p->ddR->bFunc;
  if (pDVar1 != (DdNode *)0x0) {
    Cudd_RecursiveDeref(p->ddR,pDVar1);
  }
  for (iVar2 = 0; pVVar3 = p->vRings, iVar2 < pVVar3->nSize; iVar2 = iVar2 + 1) {
    pDVar1 = (DdNode *)Vec_PtrEntry(pVVar3,iVar2);
    Cudd_RecursiveDeref(p->ddR,pDVar1);
  }
  Vec_PtrFree(pVVar3);
  Extra_StopManager(p->dd);
  Extra_StopManager(p->ddG);
  Extra_StopManager(p->ddR);
  Vec_IntFreeP(&p->vDriRefs);
  Vec_IntFreeP(&p->vVarsCs);
  Vec_IntFreeP(&p->vVarsNs);
  Vec_IntFreeP(&p->vCs2Glo);
  Vec_IntFreeP(&p->vNs2Glo);
  Vec_IntFreeP(&p->vGlo2Cs);
  Vec_IntFreeP(&p->vGlo2Ns);
  free(p);
  return;
}

Assistant:

void Llb_CoreStop( Llb_Img_t * p )
{
    DdManager * dd;
    DdNode * bTemp;
    int i;
    if ( p->vDdMans )
    Vec_PtrForEachEntry( DdManager *, p->vDdMans, dd, i )
    {
        if ( dd->bFunc )
            Cudd_RecursiveDeref( dd, dd->bFunc );
        if ( dd->bFunc2 )
            Cudd_RecursiveDeref( dd, dd->bFunc2 );
        Extra_StopManager( dd );
    }
    Vec_PtrFreeP( &p->vDdMans );
    if ( p->ddR->bFunc )
        Cudd_RecursiveDeref( p->ddR, p->ddR->bFunc );
    Vec_PtrForEachEntry( DdNode *, p->vRings, bTemp, i )
        Cudd_RecursiveDeref( p->ddR, bTemp );
    Vec_PtrFree( p->vRings );
    Extra_StopManager( p->dd );
    Extra_StopManager( p->ddG );
    Extra_StopManager( p->ddR );
    Vec_IntFreeP( &p->vDriRefs );
    Vec_IntFreeP( &p->vVarsCs );
    Vec_IntFreeP( &p->vVarsNs );
    Vec_IntFreeP( &p->vCs2Glo );
    Vec_IntFreeP( &p->vNs2Glo );
    Vec_IntFreeP( &p->vGlo2Cs );
    Vec_IntFreeP( &p->vGlo2Ns );
    ABC_FREE( p );
}